

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::Tree::_set_hierarchy(Tree *this,size_t ichild,size_t iparent,size_t iprev_sibling)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  size_t sVar5;
  NodeData *pNVar6;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  char msg_8 [45];
  char msg_7 [93];
  char msg_6 [56];
  char msg_5 [93];
  char msg_4 [56];
  NodeData *nsib;
  NodeData *psib;
  NodeData *parent;
  size_t inext_sibling;
  char msg_3 [38];
  char msg_2 [28];
  NodeData *child;
  char msg_1 [87];
  char msg [69];
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  char *in_stack_fffffffffffffb38;
  Location *in_stack_fffffffffffffb40;
  Location *this_00;
  NodeData *in_stack_fffffffffffffb70;
  Tree *in_stack_fffffffffffffb78;
  size_t local_460;
  Location local_3e8;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  char *local_390;
  undefined1 local_388 [112];
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  char *local_300;
  undefined1 local_2f8 [56];
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  char *local_2a0;
  Tree local_298;
  undefined4 uStack_198;
  undefined4 uStack_194;
  char *local_190;
  undefined1 local_188 [40];
  undefined4 local_160;
  undefined4 uStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  char *local_140;
  char local_138 [32];
  NodeData *local_118;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  char *local_f0;
  undefined1 local_e8 [88];
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  char *local_70;
  undefined1 local_68 [72];
  ulong local_20;
  size_t local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((in_RDX != 0xffffffffffffffff) && (*(ulong *)(in_RDI + 8) <= in_RDX)) {
    memcpy(local_68,"check failed: (iparent == NONE || (iparent >= 0 && iparent < m_cap))",0x45);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    (*pcVar1)(local_68,0x45,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffb18 = local_90;
    in_stack_fffffffffffffb1c = uStack_8c;
    in_stack_fffffffffffffb20 = uStack_88;
    in_stack_fffffffffffffb24 = uStack_84;
    in_stack_fffffffffffffb28 = local_80;
    in_stack_fffffffffffffb2c = uStack_7c;
    in_stack_fffffffffffffb30 = uStack_78;
    in_stack_fffffffffffffb34 = uStack_74;
    in_stack_fffffffffffffb38 = local_70;
  }
  if ((local_20 != 0xffffffffffffffff) && (*(ulong *)(in_RDI + 8) <= local_20)) {
    memcpy(local_e8,
           "check failed: (iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap))",
           0x57);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                       CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                       CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                       CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    (*pcVar1)(local_e8,0x57,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffb18 = local_110;
    in_stack_fffffffffffffb1c = uStack_10c;
    in_stack_fffffffffffffb20 = uStack_108;
    in_stack_fffffffffffffb24 = uStack_104;
    in_stack_fffffffffffffb28 = local_100;
    in_stack_fffffffffffffb2c = uStack_fc;
    in_stack_fffffffffffffb30 = uStack_f8;
    in_stack_fffffffffffffb34 = uStack_f4;
    in_stack_fffffffffffffb38 = local_f0;
  }
  local_118 = get(in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70);
  local_118->m_parent = local_18;
  local_118->m_prev_sibling = 0xffffffffffffffff;
  local_118->m_next_sibling = 0xffffffffffffffff;
  if (local_18 == 0xffffffffffffffff) {
    if (local_10 != 0) {
      builtin_strncpy(local_138,"check failed: (ichild == 0)",0x1c);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x58);
      Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                         CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      (*pcVar1)(local_138,0x1c,*(undefined8 *)(in_RDI + 0x40));
      in_stack_fffffffffffffb18 = local_160;
      in_stack_fffffffffffffb1c = uStack_15c;
      in_stack_fffffffffffffb20 = uStack_158;
      in_stack_fffffffffffffb24 = uStack_154;
      in_stack_fffffffffffffb28 = local_150;
      in_stack_fffffffffffffb2c = uStack_14c;
      in_stack_fffffffffffffb30 = uStack_148;
      in_stack_fffffffffffffb34 = uStack_144;
      in_stack_fffffffffffffb38 = local_140;
    }
    if (local_20 != 0xffffffffffffffff) {
      memcpy(local_188,"check failed: (iprev_sibling == NONE)",0x26);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x58);
      Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                         CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                         CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                         CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      (*pcVar1)(local_188,0x26,*(undefined8 *)(in_RDI + 0x40));
      in_stack_fffffffffffffb18 = local_298.m_tag_directives[3].prefix.str._0_4_;
      in_stack_fffffffffffffb1c = local_298.m_tag_directives[3].prefix.str._4_4_;
      in_stack_fffffffffffffb20 = (undefined4)local_298.m_tag_directives[3].prefix.len;
      in_stack_fffffffffffffb24 = local_298.m_tag_directives[3].prefix.len._4_4_;
      in_stack_fffffffffffffb28 = (undefined4)local_298.m_tag_directives[3].next_node_id;
      in_stack_fffffffffffffb2c = local_298.m_tag_directives[3].next_node_id._4_4_;
      in_stack_fffffffffffffb30 = uStack_198;
      in_stack_fffffffffffffb34 = uStack_194;
      in_stack_fffffffffffffb38 = local_190;
    }
  }
  if (local_18 != 0xffffffffffffffff) {
    if (local_20 == 0xffffffffffffffff) {
      local_460 = first_child((Tree *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                              CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    }
    else {
      local_460 = next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20)
                               ,CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    }
    local_298.m_tag_directives[3].handle.len = local_460;
    local_298.m_tag_directives[3].handle.str =
         (char *)get(in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70);
    local_298.m_tag_directives[2].next_node_id =
         (size_t)get(in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70);
    local_298.m_tag_directives[2].prefix.len =
         (size_t)get(in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70);
    if ((NodeData *)local_298.m_tag_directives[2].next_node_id != (NodeData *)0x0) {
      sVar4 = next_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                           CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      sVar5 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      if (sVar4 != sVar5) {
        memcpy(&local_298.m_tag_directives[1].handle.len,
               "check failed: (next_sibling(iprev_sibling) == id(nsib))",0x38);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x58);
        Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*pcVar1)(&local_298.m_tag_directives[1].handle.len,0x38,*(undefined8 *)(in_RDI + 0x40));
        in_stack_fffffffffffffb18 = (undefined4)local_298.m_tag_directives[0].handle.len;
        in_stack_fffffffffffffb1c = local_298.m_tag_directives[0].handle.len._4_4_;
        in_stack_fffffffffffffb20 = local_298.m_tag_directives[0].prefix.str._0_4_;
        in_stack_fffffffffffffb24 = local_298.m_tag_directives[0].prefix.str._4_4_;
        in_stack_fffffffffffffb28 = (undefined4)local_298.m_tag_directives[0].prefix.len;
        in_stack_fffffffffffffb2c = local_298.m_tag_directives[0].prefix.len._4_4_;
        in_stack_fffffffffffffb30 = (undefined4)local_298.m_tag_directives[0].next_node_id;
        in_stack_fffffffffffffb34 = local_298.m_tag_directives[0].next_node_id._4_4_;
        in_stack_fffffffffffffb38 = local_298.m_tag_directives[1].handle.str;
      }
      sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_118->m_prev_sibling = sVar4;
      sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      *(size_t *)(local_298.m_tag_directives[2].next_node_id + 0x80) = sVar4;
      if ((*(size_t *)(local_298.m_tag_directives[2].next_node_id + 0x88) ==
           *(size_t *)(local_298.m_tag_directives[2].next_node_id + 0x80)) &&
         (*(size_t *)(local_298.m_tag_directives[2].next_node_id + 0x88) != 0xffffffffffffffff)) {
        memcpy(&local_298,
               "check failed: (psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE)"
               ,0x5d);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x58);
        in_stack_fffffffffffffb78 = &local_298;
        Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*pcVar1)(in_stack_fffffffffffffb78,0x5d,*(undefined8 *)(in_RDI + 0x40));
        in_stack_fffffffffffffb18 = local_2c0;
        in_stack_fffffffffffffb1c = uStack_2bc;
        in_stack_fffffffffffffb20 = uStack_2b8;
        in_stack_fffffffffffffb24 = uStack_2b4;
        in_stack_fffffffffffffb28 = local_2b0;
        in_stack_fffffffffffffb2c = uStack_2ac;
        in_stack_fffffffffffffb30 = uStack_2a8;
        in_stack_fffffffffffffb34 = uStack_2a4;
        in_stack_fffffffffffffb38 = local_2a0;
      }
    }
    if ((NodeData *)local_298.m_tag_directives[2].prefix.len != (NodeData *)0x0) {
      in_stack_fffffffffffffb70 =
           (NodeData *)
           prev_sibling((Tree *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                        CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      pNVar6 = (NodeData *)id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      if (in_stack_fffffffffffffb70 != pNVar6) {
        memcpy(local_2f8,"check failed: (prev_sibling(inext_sibling) == id(psib))",0x38);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x58);
        Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*pcVar1)(local_2f8,0x38,*(undefined8 *)(in_RDI + 0x40));
        in_stack_fffffffffffffb20 = uStack_318;
        in_stack_fffffffffffffb24 = uStack_314;
        in_stack_fffffffffffffb28 = local_310;
        in_stack_fffffffffffffb2c = uStack_30c;
        in_stack_fffffffffffffb30 = uStack_308;
        in_stack_fffffffffffffb34 = uStack_304;
        in_stack_fffffffffffffb38 = local_300;
      }
      sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      local_118->m_next_sibling = sVar4;
      sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      *(size_t *)(local_298.m_tag_directives[2].prefix.len + 0x88) = sVar4;
      if ((*(size_t *)(local_298.m_tag_directives[2].prefix.len + 0x88) ==
           *(size_t *)(local_298.m_tag_directives[2].prefix.len + 0x80)) &&
         (*(size_t *)(local_298.m_tag_directives[2].prefix.len + 0x88) != 0xffffffffffffffff)) {
        memcpy(local_388,
               "check failed: (nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE)"
               ,0x5d);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x58);
        Location::Location(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*pcVar1)(local_388,0x5d,*(undefined8 *)(in_RDI + 0x40));
        in_stack_fffffffffffffb20 = uStack_3a8;
        in_stack_fffffffffffffb24 = uStack_3a4;
        in_stack_fffffffffffffb28 = local_3a0;
        in_stack_fffffffffffffb2c = uStack_39c;
        in_stack_fffffffffffffb30 = uStack_398;
        in_stack_fffffffffffffb34 = uStack_394;
        in_stack_fffffffffffffb38 = local_390;
      }
    }
    if (*(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x70) == 0xffffffffffffffff) {
      if (*(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x78) != 0xffffffffffffffff)
      {
        memcpy(&local_3e8,"check failed: (parent->m_last_child == NONE)",0x2d);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = *(code **)(in_RDI + 0x58);
        this_00 = &local_3e8;
        Location::Location(this_00,in_stack_fffffffffffffb38,
                           CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
                           CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                           CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
        (*pcVar1)(this_00,0x2d,*(undefined8 *)(in_RDI + 0x40));
      }
      sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      *(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x70) = sVar4;
      sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
      *(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x78) = sVar4;
    }
    else {
      if (local_118->m_next_sibling ==
          *(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x70)) {
        sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        *(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x70) = sVar4;
      }
      if (local_118->m_prev_sibling ==
          *(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x78)) {
        sVar4 = id(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70);
        *(size_t *)((long)local_298.m_tag_directives[3].handle.str + 0x78) = sVar4;
      }
    }
  }
  return;
}

Assistant:

void Tree::_set_hierarchy(size_t ichild, size_t iparent, size_t iprev_sibling)
{
    _RYML_CB_ASSERT(m_callbacks, iparent == NONE || (iparent >= 0 && iparent < m_cap));
    _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap));

    NodeData *C4_RESTRICT child = get(ichild);

    child->m_parent = iparent;
    child->m_prev_sibling = NONE;
    child->m_next_sibling = NONE;

    if(iparent == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, ichild == 0);
        _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE);
    }

    if(iparent == NONE)
        return;

    size_t inext_sibling = iprev_sibling != NONE ? next_sibling(iprev_sibling) : first_child(iparent);
    NodeData *C4_RESTRICT parent = get(iparent);
    NodeData *C4_RESTRICT psib   = get(iprev_sibling);
    NodeData *C4_RESTRICT nsib   = get(inext_sibling);

    if(psib)
    {
        _RYML_CB_ASSERT(m_callbacks, next_sibling(iprev_sibling) == id(nsib));
        child->m_prev_sibling = id(psib);
        psib->m_next_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE);
    }

    if(nsib)
    {
        _RYML_CB_ASSERT(m_callbacks, prev_sibling(inext_sibling) == id(psib));
        child->m_next_sibling = id(nsib);
        nsib->m_prev_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE);
    }

    if(parent->m_first_child == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, parent->m_last_child == NONE);
        parent->m_first_child = id(child);
        parent->m_last_child = id(child);
    }
    else
    {
        if(child->m_next_sibling == parent->m_first_child)
            parent->m_first_child = id(child);

        if(child->m_prev_sibling == parent->m_last_child)
            parent->m_last_child = id(child);
    }
}